

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dgeadd_is(int m,int n,double *a,int lda,double *b,int ldb)

{
  int iVar1;
  int local_34;
  int local_30;
  int j;
  int i;
  int ldb_local;
  double *b_local;
  int lda_local;
  double *a_local;
  int n_local;
  int m_local;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3b,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3c,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3d,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if ((0 < ldb) && (n <= ldb)) {
    for (local_30 = 0; local_30 < m; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
        iVar1 = local_30 * ldb + local_34;
        b[iVar1] = a[local_30 * lda + local_34] + b[iVar1];
      }
    }
    return;
  }
  __assert_fail("ldb >= 1 && ldb >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x3e,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
}

Assistant:

void la_dgeadd_is(
        int m, int n,
        const double *a, int lda,
        double *b, int ldb)
{
    assert(a);
    assert(b);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            b[i * ldb + j] += a[i * lda + j];
        }
    }
}